

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factorgraph.cpp
# Opt level: O2

void libDAI::RemoveShortLoops
               (vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *P)

{
  TFactor<double> *pTVar1;
  TFactor<double> *pTVar2;
  ostream *poVar3;
  TFactor<double> *this;
  ulong uVar4;
  const_iterator __position;
  VarSet local_50;
  
LAB_004dea8a:
  pTVar2 = (P->
           super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  pTVar1 = (P->
           super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  do {
    this = pTVar1;
    if (this == pTVar2) {
      return;
    }
    for (__position._M_current = this + 1; pTVar1 = this + 1, __position._M_current != pTVar2;
        __position._M_current = __position._M_current + 1) {
      VarSet::operator&(&local_50,&this->_vs,&(__position._M_current)->_vs);
      uVar4 = (long)local_50._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)local_50._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                    _M_impl.super__Vector_impl_data._M_start;
      std::_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>::~_Vector_base
                ((_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_> *)&local_50);
      if (0x10 < uVar4) {
        poVar3 = std::operator<<((ostream *)&std::cout,"Merging factors ");
        poVar3 = operator<<(poVar3,&this->_vs);
        poVar3 = std::operator<<(poVar3," and ");
        poVar3 = operator<<(poVar3,&(__position._M_current)->_vs);
        std::endl<char,std::char_traits<char>>(poVar3);
        TFactor<double>::operator*=(this,__position._M_current);
        std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::erase
                  (P,__position);
        goto LAB_004dea8a;
      }
      pTVar2 = (P->
               super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
    }
  } while( true );
}

Assistant:

void RemoveShortLoops(std::vector<Factor> &P) {
        bool found = true;
        while( found ) {
            found = false;
            vector<Factor>::iterator I, J;
            for( I = P.begin(); I != P.end(); I++ ) {
                J = I;
                J++;
                for( ; J != P.end(); J++ )
                    if( (I->vars() & J->vars()).size() >= 2 ) {
                        found = true;
                        break;
                    }
                if( found )
                    break;
            }
            if( found ) {
                cout << "Merging factors " << I->vars() << " and " << J->vars() << endl;
                *I *= *J;
                P.erase(J);
            }
        }
    }